

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  int canfd_on;
  timeval start_tv;
  canfd_frame frame;
  timeval end_tv;
  sockaddr_can addr;
  fd_set rdfs;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  ulong local_1e0;
  uint local_1d8;
  uint local_1d4;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  uint local_1a8;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  long local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  timeval local_158;
  long local_148;
  long local_140;
  uint local_138;
  byte local_134;
  byte local_133;
  byte local_130 [64];
  long local_f0;
  long local_e8;
  sockaddr local_e0;
  fd_set local_c8;
  uint local_48;
  undefined4 local_44;
  uint local_40;
  undefined4 local_3c;
  
  local_1f4 = 1;
  local_1b0 = 0;
  local_1e8 = 0xffffffff;
  local_1e4 = 0xffffffff;
  local_1d4 = 0;
  uVar14 = 0;
  uVar4 = 0;
LAB_00101421:
  do {
    while (iVar2 = getopt(argc,argv,"s:d:x:X:?"), iVar2 == 0x58) {
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      uVar4 = uVar4 & 0xff;
      uVar14 = 1;
    }
    uVar15 = (uint)uVar4;
    if (iVar2 < 0x73) {
      if (iVar2 == -1) {
        if (((argc - _optind != 1) || (local_1e8 == 0xffffffff)) || (local_1e4 == 0xffffffff))
        goto LAB_00101de6;
        uVar3 = socket(0x1d,3,1);
        if ((int)uVar3 < 0) {
          pcVar11 = "socket";
        }
        else {
          setsockopt(uVar3,0x65,5,&local_1f4,4);
          local_48 = 0x9fffffff;
          if (-1 < (int)local_1e8) {
            local_48 = 0x7ff;
          }
          local_44 = 0xdfffffff;
          if (-1 < (int)local_1e8) {
            local_44 = 0xc00007ff;
          }
          local_48 = local_48 & local_1e8;
          local_40 = 0x9fffffff;
          if (-1 < (int)local_1e4) {
            local_40 = 0x7ff;
          }
          local_3c = 0xdfffffff;
          if (-1 < (int)local_1e4) {
            local_3c = 0xc00007ff;
          }
          local_40 = local_40 & local_1e4;
          setsockopt(uVar3,0x65,1,&local_48,0x10);
          local_e0.sa_family = 0x1d;
          local_e0.sa_data._2_4_ = if_nametoindex(argv[_optind]);
          if (local_e0.sa_data._2_4_ != 0) {
            iVar2 = bind(uVar3,&local_e0,0x18);
            if (iVar2 < 0) {
              perror("bind");
              return 1;
            }
            uVar9 = 1L << ((byte)uVar3 & 0x3f);
            uVar4 = (ulong)(uVar3 >> 6);
            local_c8.fds_bits[0xe] = 0;
            local_c8.fds_bits[0xf] = 0;
            local_c8.fds_bits[0xc] = 0;
            local_c8.fds_bits[0xd] = 0;
            local_c8.fds_bits[10] = 0;
            local_c8.fds_bits[0xb] = 0;
            local_c8.fds_bits[8] = 0;
            local_c8.fds_bits[9] = 0;
            local_c8.fds_bits[6] = 0;
            local_c8.fds_bits[7] = 0;
            local_c8.fds_bits[4] = 0;
            local_c8.fds_bits[5] = 0;
            local_c8.fds_bits[2] = 0;
            local_c8.fds_bits[3] = 0;
            local_c8.fds_bits[0] = 0;
            local_c8.fds_bits[1] = 0;
            local_c8.fds_bits[uVar4] = local_c8.fds_bits[uVar4] | uVar9;
            local_1e8 = uVar3 + 1;
            local_158.tv_sec = 1;
            local_158.tv_usec = 0;
            local_1ec = uVar3;
            uVar3 = select(local_1e8,&local_c8,(fd_set *)0x0,(fd_set *)0x0,&local_158);
            if ((int)uVar3 < 0) goto LAB_00101d56;
            local_168 = uVar14 | 2;
            local_180 = local_1b0 & 0xffffffff;
            local_1c0 = local_180 + 1;
            local_1c8 = local_180 | 2;
            local_170 = local_180 | 4;
            local_1a8 = (uint)local_1b0 | 6;
            local_178 = (long)(int)~(uint)local_1b0;
            local_198 = 0;
            local_1a0 = 0;
            local_1b8 = 0;
            local_1d8 = 0;
            local_1e0 = 0;
            uVar13 = 0;
            uVar10 = 0;
            local_1d0 = 0;
            local_1f0 = uVar15;
            local_1a4 = (int)uVar14;
            local_190 = uVar4;
            local_188 = uVar9;
            local_160 = uVar14;
            break;
          }
          pcVar11 = "if_nametoindex";
          local_e0.sa_data[2] = '\0';
          local_e0.sa_data[3] = '\0';
          local_e0.sa_data[4] = '\0';
          local_e0.sa_data[5] = '\0';
        }
        perror(pcVar11);
        return 1;
      }
      if (iVar2 != 100) {
        local_1f0 = uVar15;
        if (iVar2 == 0x3f) {
          main_cold_1();
        }
LAB_00101ddc:
        main_cold_3();
LAB_00101de6:
        main_cold_2();
        halt_baddata();
      }
      local_1f0 = uVar15;
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      sVar5 = strlen(_optarg);
      local_1e4 = (uint)uVar4 | 0x80000000;
      if (sVar5 < 8) {
        local_1e4 = (uint)uVar4;
      }
    }
    else {
      if (iVar2 == 0x78) {
        uVar9 = strtoul(_optarg,(char **)0x0,0x10);
        local_1d4 = (uint)uVar9 & 0xff;
        local_1b0 = 1;
        goto LAB_00101421;
      }
      local_1f0 = uVar15;
      if (iVar2 != 0x73) goto LAB_00101ddc;
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      sVar5 = strlen(_optarg);
      local_1e8 = (uint)uVar4 | 0x80000000;
      if (sVar5 < 8) {
        local_1e8 = (uint)uVar4;
      }
    }
    uVar4 = (ulong)local_1f0;
  } while( true );
  do {
    if ((uVar10 != 0) && ((local_c8.fds_bits[uVar4] & uVar9) == 0)) {
      printf("\r%-*s",0x4e," (transmission timed out)");
LAB_00101936:
      local_1e0 = 0;
      goto LAB_0010193f;
    }
    uVar14 = read(local_1ec,&local_138,0x48);
    uVar3 = (uint)uVar14;
    if ((int)uVar3 < 0) {
      perror("read");
      break;
    }
    uVar15 = uVar3 & 0x7fffffff;
    if ((uVar15 != 0x10) && (uVar15 != 0x48)) {
      fprintf(_stderr,"read: incomplete CAN frame %zu %d\n",0x48,uVar14 & 0xffffffff);
      break;
    }
    if (uVar10 == 0) {
LAB_001017d1:
      if (((int)local_1b0 == 0) || (local_1d4 == local_130[0])) {
        if (local_138 == local_1e4) {
          if (((local_1a4 != 0) && (local_1f0 != local_130[0])) ||
             ((local_130[local_160] & 0xf0) != 0x30)) goto LAB_00101954;
          local_198 = (ulong)local_130[local_160 + 1];
          local_1a0 = CONCAT71((int7)(local_168 >> 8),local_130[local_168]);
        }
        bVar1 = local_130[local_180];
        uVar3 = bVar1 & 0xfffffff0;
        if (uVar3 == 0x20) {
          if (uVar10 != 0) {
            uVar15 = bVar1 & 0xf;
            if (uVar15 == ((int)local_1d0 + 1U & 0xf)) {
              uVar10 = uVar10 + local_178 + (ulong)local_134;
              local_1d0 = (ulong)uVar15;
              goto LAB_00101b35;
            }
            goto LAB_00101b3e;
          }
LAB_0010193f:
          uVar10 = 0;
        }
        else {
          if (uVar3 == 0x10) {
            uVar3 = (uint)local_130[local_1c0] | (bVar1 & 0xf) << 8;
            if (uVar3 == 0) {
              uVar14 = (ulong)local_130[local_180 + 5] |
                       (ulong)local_130[local_170] << 8 |
                       (long)(int)((uint)local_130[local_1c8] << 0x18) |
                       (ulong)local_130[local_180 + 3] << 0x10;
              if (0x418936 < (uint)uVar14) {
                printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n");
                goto LAB_00101936;
              }
              uVar6 = (ulong)local_1a8;
            }
            else {
              uVar14 = (ulong)uVar3;
              uVar6 = local_1c8;
            }
            uVar13 = 1;
            uVar10 = uVar14;
            if (9 < uVar14) {
              do {
                uVar13 = uVar13 + 1;
                uVar3 = (uint)uVar10;
                uVar10 = (uVar10 & 0xffffffff) / 10;
              } while (99 < uVar3);
            }
            local_1d8 = (uint)local_134;
            uVar10 = (ulong)(int)(local_1d8 - (int)uVar6);
            local_1b8 = CONCAT71((int7)(uVar6 >> 8),local_133) & 0xffffffffffffff01;
            local_1e0 = uVar14;
            ioctl(local_1ec,0x8906,&local_148);
            local_1f4 = (uint)(uVar15 != 0x10);
            local_1d0 = 0;
          }
          else if ((bVar1 & 0xf0) == 0) {
            uVar6 = (ulong)bVar1 & 0xf;
            uVar14 = local_1c0;
            if ((bVar1 & 0xf) == 0) {
              uVar6 = (ulong)local_130[local_1c0];
              uVar14 = local_1c8;
            }
            uVar10 = 0;
            if (uVar14 + uVar6 <= (ulong)local_134) {
              uVar10 = uVar6;
            }
            uVar13 = 1;
            uVar14 = uVar10;
            if (9 < uVar10) {
              do {
                uVar13 = uVar13 + 1;
                uVar3 = (uint)uVar14;
                uVar14 = uVar14 / 10;
              } while (99 < uVar3);
            }
            local_1b8 = (ulong)local_133 & 0xffffffffffffff01;
            local_1d8 = (uint)local_134;
            if (local_134 < 9) {
              local_1d8 = 8;
            }
            ioctl(local_1ec,0x8906,&local_148);
            local_1e0 = uVar10;
            if (uVar15 == 0x10) {
              local_1f4 = 0;
            }
            else {
              local_1f4 = 1;
            }
          }
LAB_00101b35:
          if (uVar10 == 0) goto LAB_0010193f;
LAB_00101b3e:
          uVar4 = local_1e0;
          if (uVar10 < local_1e0) {
            uVar4 = uVar10;
          }
          uVar15 = 0;
          uVar14 = (uVar4 * 100) / local_1e0;
          printf("\r %3lu%% ",uVar14,(uVar4 * 100) % local_1e0);
          putchar(0x7c);
          if (99 < uVar14) {
            uVar14 = 100;
          }
          do {
            iVar2 = 0x2e;
            if (uVar15 < ((uint)(uVar14 >> 1) & 0x7fffffff)) {
              iVar2 = 0x58;
            }
            putchar(iVar2);
            uVar6 = local_1e0;
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0x32);
          printf("| %*lu/%lu ",(ulong)uVar13,uVar4);
          bVar16 = uVar6 <= uVar10;
          uVar9 = local_188;
          uVar10 = uVar4;
          uVar4 = local_190;
          if (bVar16) {
            pcVar11 = "CAN-FD";
            if (local_1f4 == 0) {
              pcVar11 = "CAN2.0";
            }
            uVar7 = 0x2a;
            if ((char)local_1b8 == '\0') {
              uVar7 = 0x20;
            }
            printf("\r%s %02d%c (BS:%2hhu # ",pcVar11,(ulong)(byte)local_1d8,uVar7,local_198 & 0xff)
            ;
            uVar9 = local_188;
            uVar4 = local_190;
            uVar14 = local_1a0 & 0xff;
            if ((char)local_1a0 < '\0') {
              if ((byte)((char)local_1a0 + 0xfU) < 9) {
                uVar14 = (ulong)(((uint)uVar14 & 0xf) * 100);
                pcVar11 = "STmin:%3u usec)";
                goto LAB_00101c51;
              }
              printf("STmin: invalid   )");
            }
            else {
              pcVar11 = "STmin:%3hhu msec)";
LAB_00101c51:
              printf(pcVar11,uVar14);
            }
            printf(" : %lu byte in ",uVar6);
            ioctl(local_1ec,0x8906,&local_f0);
            lVar12 = local_e8 - local_140;
            lVar8 = lVar12 + 1000000;
            if (-1 < lVar12) {
              lVar8 = lVar12;
            }
            lVar12 = (lVar12 >> 0x3f) + (local_f0 - local_148);
            if (lVar12 < 0) {
              lVar8 = 0;
            }
            if (lVar12 < 1) {
              lVar12 = 0;
            }
            uVar14 = lVar8 / 1000 + lVar12 * 1000;
            if (uVar14 == 0) {
              printf("(no time available)     ");
            }
            else {
              printf("%llu.%06llus ",lVar12,lVar8);
              printf("=> %lu byte/s",(uVar6 * 1000) / uVar14,(uVar6 * 1000) % uVar14);
            }
            putchar(10);
            goto LAB_00101936;
          }
        }
        fflush(_stdout);
      }
    }
    else if ((uVar15 == 0x48 || local_1f4 == 0) && (uVar15 == 0x10 || local_1f4 != 0))
    goto LAB_001017d1;
LAB_00101954:
    local_c8.fds_bits[0xe] = 0;
    local_c8.fds_bits[0xf] = 0;
    local_c8.fds_bits[0xc] = 0;
    local_c8.fds_bits[0xd] = 0;
    local_c8.fds_bits[10] = 0;
    local_c8.fds_bits[0xb] = 0;
    local_c8.fds_bits[8] = 0;
    local_c8.fds_bits[9] = 0;
    local_c8.fds_bits[6] = 0;
    local_c8.fds_bits[7] = 0;
    local_c8.fds_bits[4] = 0;
    local_c8.fds_bits[5] = 0;
    local_c8.fds_bits[2] = 0;
    local_c8.fds_bits[3] = 0;
    local_c8.fds_bits[0] = 0;
    local_c8.fds_bits[1] = 0;
    local_c8.fds_bits[uVar4] = local_c8.fds_bits[uVar4] | uVar9;
    local_158.tv_sec = 1;
    local_158.tv_usec = 0;
    uVar3 = select(local_1e8,&local_c8,(fd_set *)0x0,(fd_set *)0x0,&local_158);
  } while (-1 < (int)uVar3);
LAB_00101d56:
  close(local_1ec);
  return uVar3;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	int running = 1;
	struct sockaddr_can addr;
	struct can_filter rfilter[2];
	struct canfd_frame frame;
	int canfd_on = 1;
	int nbytes, i, ret;
	canid_t src = NO_CAN_ID;
	canid_t dst = NO_CAN_ID;
	int ext = 0;
	int extaddr = 0;
	int rx_ext = 0;
	int rx_extaddr = 0;
	int datidx = 0;
	unsigned char bs = 0;
	unsigned char stmin = 0;
	unsigned char brs = 0;
	unsigned char ll_dl = 0;
	unsigned long fflen = 0;
	unsigned fflen_digits = 0;
	unsigned long rcvlen = 0;
	unsigned long percent = 0;
	struct timeval start_tv, end_tv, diff_tv, timeo;
	unsigned int n_pci;
	unsigned int sn, last_sn = 0;
	int opt;

	while ((opt = getopt(argc, argv, "s:d:x:X:?")) != -1) {
		switch (opt) {
		case 's':
			src = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				src |= CAN_EFF_FLAG;
			break;

		case 'd':
			dst = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				dst |= CAN_EFF_FLAG;
			break;

		case 'x':
			ext = 1;
			extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'X':
			rx_ext = 1;
			rx_extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind) != 1 || src == NO_CAN_ID || dst == NO_CAN_ID) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	/* try to switch the socket into CAN FD mode */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfd_on, sizeof(canfd_on));

	/* set single CAN ID raw filters for src and dst frames */
	if (src & CAN_EFF_FLAG) {
		rfilter[0].can_id   = src & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[0].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[0].can_id   = src & CAN_SFF_MASK;
		rfilter[0].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	if (dst & CAN_EFF_FLAG) {
		rfilter[1].can_id   = dst & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[1].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[1].can_id   = dst & CAN_SFF_MASK;
		rfilter[1].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, &rfilter, sizeof(rfilter));

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(s, &rdfs);

		/* timeout for ISO TP transmissions */
		timeo.tv_sec  = 1;
		timeo.tv_usec = 0;

		if ((ret = select(s+1, &rdfs, NULL, NULL, &timeo)) < 0) {
			running = 0;
			continue;
		}

		/* detected timeout of already started transmission */
		if (rcvlen && !(FD_ISSET(s, &rdfs))) {
			printf("\r%-*s",78, " (transmission timed out)");
			fflush(stdout);
			fflen = rcvlen = 0;
			continue;
		}

		nbytes = read(s, &frame, sizeof(frame));
		if (nbytes < 0) {
			perror("read");
			ret = nbytes;
			running = 0;
			continue;
		}
		if (nbytes != CAN_MTU && nbytes != CANFD_MTU) {
			fprintf(stderr, "read: incomplete CAN frame %zu %d\n", sizeof(frame), nbytes);
			ret = nbytes;
			running = 0;
			continue;
		}

		if (rcvlen) {
			/* make sure to process only the detected PDU CAN frame type */
			if (canfd_on && (nbytes != CANFD_MTU))
				continue;
			if (!canfd_on && (nbytes != CAN_MTU))
				continue;
		}

			/* check extended address if provided */
			if (ext && extaddr != frame.data[0])
				continue;

			/* only get flow control information from dst CAN ID */
			if (frame.can_id == dst) {
				/* check extended address if provided */
				if (rx_ext && frame.data[0] != rx_extaddr)
					continue;

				n_pci = frame.data[rx_ext];
				/* check flow control PCI only */
				if ((n_pci & 0xF0) != 0x30)
					continue;

				bs = frame.data[rx_ext + 1];
				stmin = frame.data[rx_ext + 2];
			}

			/* data content starts and index datidx */
			datidx = 0;

			n_pci = frame.data[ext];
			switch (n_pci & 0xF0) {

			case 0x00:
				/* SF */
				if (n_pci & 0xF) {
					fflen = rcvlen = n_pci & 0xF;
					datidx = ext+1;
				} else {
					fflen = rcvlen = frame.data[ext + 1];
					datidx = ext+2;
				}

				/* ignore incorrect SF PDUs */
				if (frame.len < rcvlen + datidx)
					fflen = rcvlen = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;
				if (ll_dl < 8)
					ll_dl = 8;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x10:
				/* FF */
				fflen = ((n_pci & 0x0F)<<8) + frame.data[ext+1];
				if (fflen)
					datidx = ext+2;
				else {
					fflen = (frame.data[ext+2]<<24) +
						(frame.data[ext+3]<<16) +
						(frame.data[ext+4]<<8) +
						frame.data[ext+5];
					datidx = ext+6;
				}

				/* to increase the time resolution we multiply fflen with 1000 later */
				if (fflen >= (UINT32_MAX / 1000)) {
					printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n", fflen);
					fflush(stdout);
					fflen = rcvlen = 0;
					continue;
				}
				rcvlen = frame.len - datidx;
				last_sn = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x20:
				/* CF */
				if (rcvlen) {
					sn = n_pci & 0x0F;
					if (sn == ((last_sn + 1) & 0xF)) {
						last_sn = sn;
						datidx = ext+1;
						rcvlen += frame.len - datidx;
					}
				}
				break;

			default:
				break;
			}

			/* PDU reception in process */
			if (rcvlen) {
				if (rcvlen > fflen)
					rcvlen = fflen;

				percent = (rcvlen * 100 / fflen);
				printf("\r %3lu%% ", percent);

				printf("|");

				if (percent > 100)
					percent = 100;

				for (i=0; i < NUMBAR; i++){
					if (i < (int)(percent/PERCENTRES))
						printf("X");
					else
						printf(".");
				}
				printf("| %*lu/%lu ", fflen_digits, rcvlen, fflen);
			}

			/* PDU complete */
			if (rcvlen && rcvlen >= fflen) {

				printf("\r%s %02d%c (BS:%2hhu # ", canfd_on?"CAN-FD":"CAN2.0", ll_dl, brs?'*':' ', bs);
				if (stmin < 0x80)
					printf("STmin:%3hhu msec)", stmin);
				else if (stmin > 0xF0 && stmin < 0xFA)
					printf("STmin:%3u usec)", (stmin & 0xF) * 100);
				else
					printf("STmin: invalid   )");

				printf(" : %lu byte in ", fflen);

				/* calculate time */
				ioctl(s, SIOCGSTAMP, &end_tv);
				diff_tv.tv_sec  = end_tv.tv_sec  - start_tv.tv_sec;
				diff_tv.tv_usec = end_tv.tv_usec - start_tv.tv_usec;
				if (diff_tv.tv_usec < 0)
					diff_tv.tv_sec--, diff_tv.tv_usec += 1000000;
				if (diff_tv.tv_sec < 0)
					diff_tv.tv_sec = diff_tv.tv_usec = 0;

				/* check devisor to be not zero */
				if (diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000){
					printf("%llu.%06llus ", (unsigned long long)diff_tv.tv_sec, (unsigned long long)diff_tv.tv_usec);
					printf("=> %lu byte/s", (fflen * 1000) /
					       (unsigned long)(diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000));
				} else
					printf("(no time available)     ");

				printf("\n");
				/* wait for next PDU */
				fflen = rcvlen = 0;
			}
			fflush(stdout);
	}

	close(s);

	return ret;
}